

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O3

QNetworkInterface __thiscall
QNativeSocketEnginePrivate::nativeMulticastInterface(QNativeSocketEnginePrivate *this)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  QNetworkInterface *this_00;
  undefined1 *puVar3;
  undefined1 *puVar4;
  long in_FS_OFFSET;
  socklen_t sizeofv_1;
  uint v_1;
  QHostAddress ipv4;
  socklen_t sizeofv;
  in_addr v;
  QNetworkAddressEntry local_90;
  QArrayDataPointer<QNetworkAddressEntry> local_88;
  QArrayDataPointer<QNetworkInterface> local_68;
  QHostAddress local_48;
  socklen_t local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RSI + 0xa0) - 1U < 2) {
    local_68.d = (Data *)CONCAT44(local_68.d._4_4_,0xaaaaaaaa);
    local_88.d = (Data *)CONCAT44(local_88.d._4_4_,4);
    iVar2 = getsockopt(*(int *)(in_RSI + 0xd8),0x29,0x11,&local_68,(socklen_t *)&local_88);
    if (iVar2 != -1) {
      QNetworkInterface::interfaceFromIndex((int)this);
      goto LAB_0022fa4a;
    }
  }
  else {
    local_3c = 0;
    local_40 = 4;
    iVar2 = getsockopt(*(int *)(in_RSI + 0xd8),0,0x20,&local_3c,&local_40);
    if (((iVar2 != -1) && (local_3c != 0)) && (3 < local_40)) {
      local_48.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QHostAddress::QHostAddress
                (&local_48,
                 local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
                 local_3c << 0x18);
      local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.ptr = (QNetworkInterface *)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkInterface::allInterfaces();
      if ((undefined1 *)local_68.size != (undefined1 *)0x0) {
        puVar4 = (undefined1 *)0x0;
        do {
          this_00 = (QNetworkInterface *)(local_68.ptr + (long)puVar4);
          local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_88.ptr = (QNetworkAddressEntry *)&DAT_aaaaaaaaaaaaaaaa;
          QNetworkInterface::addressEntries((QList<QNetworkAddressEntry> *)&local_88,this_00);
          if ((undefined1 *)local_88.size != (undefined1 *)0x0) {
            puVar3 = (undefined1 *)0x0;
            do {
              QNetworkAddressEntry::ip(&local_90);
              bVar1 = QHostAddress::operator==((QHostAddress *)&local_90,&local_48);
              QHostAddress::~QHostAddress((QHostAddress *)&local_90);
              if (bVar1) {
                QNetworkInterface::QNetworkInterface
                          ((QNetworkInterface *)this,(QNetworkInterface *)this_00);
                QArrayDataPointer<QNetworkAddressEntry>::~QArrayDataPointer(&local_88);
                QArrayDataPointer<QNetworkInterface>::~QArrayDataPointer(&local_68);
                QHostAddress::~QHostAddress(&local_48);
                goto LAB_0022fa4a;
              }
              puVar3 = puVar3 + 1;
            } while (puVar3 < (ulong)local_88.size);
          }
          QArrayDataPointer<QNetworkAddressEntry>::~QArrayDataPointer(&local_88);
          puVar4 = puVar4 + 1;
        } while (puVar4 < (ulong)local_68.size);
      }
      QArrayDataPointer<QNetworkInterface>::~QArrayDataPointer(&local_68);
      QHostAddress::~QHostAddress(&local_48);
    }
  }
  QNetworkInterface::QNetworkInterface((QNetworkInterface *)this);
LAB_0022fa4a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSharedDataPointer<QNetworkInterfacePrivate>)
           (QSharedDataPointer<QNetworkInterfacePrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkInterface QNativeSocketEnginePrivate::nativeMulticastInterface() const
{
    if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
        uint v;
        QT_SOCKOPTLEN_T sizeofv = sizeof(v);
        if (::getsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_MULTICAST_IF, &v, &sizeofv) == -1)
            return QNetworkInterface();
        return QNetworkInterface::interfaceFromIndex(v);
    }

#if defined(Q_OS_SOLARIS)
    struct in_addr v = { 0, 0, 0, 0};
#else
    struct in_addr v = { 0 };
#endif
    QT_SOCKOPTLEN_T sizeofv = sizeof(v);
    if (::getsockopt(socketDescriptor, IPPROTO_IP, IP_MULTICAST_IF, &v, &sizeofv) == -1)
        return QNetworkInterface();
    if (v.s_addr != 0 && sizeofv >= QT_SOCKOPTLEN_T(sizeof(v))) {
        QHostAddress ipv4(ntohl(v.s_addr));
        QList<QNetworkInterface> ifaces = QNetworkInterface::allInterfaces();
        for (int i = 0; i < ifaces.size(); ++i) {
            const QNetworkInterface &iface = ifaces.at(i);
            QList<QNetworkAddressEntry> entries = iface.addressEntries();
            for (int j = 0; j < entries.size(); ++j) {
                const QNetworkAddressEntry &entry = entries.at(j);
                if (entry.ip() == ipv4)
                    return iface;
            }
        }
    }
    return QNetworkInterface();
}